

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O0

int check_acl(mg_context *phys_ctx,usa *sa)

{
  int iVar1;
  char *local_48;
  char *list;
  vec vec;
  int matched;
  int flag;
  int allowed;
  usa *sa_local;
  mg_context *phys_ctx_local;
  
  if (phys_ctx == (mg_context *)0x0) {
    phys_ctx_local._4_4_ = 0xffffffff;
  }
  else {
    local_48 = (phys_ctx->dd).config[0x25];
    matched = 0x2d;
    if (local_48 == (char *)0x0) {
      matched = 0x2b;
    }
    while (local_48 = next_option(local_48,(vec *)&list,(vec *)0x0), local_48 != (char *)0x0) {
      iVar1 = (int)*list;
      vec.len._4_4_ = -1;
      if ((vec.ptr != (char *)0x0) && ((iVar1 == 0x2b || (iVar1 == 0x2d)))) {
        list = list + 1;
        vec.ptr = vec.ptr + -1;
        vec.len._4_4_ = parse_match_net((vec *)&list,sa,1);
      }
      if (vec.len._4_4_ < 0) {
        mg_cry_internal_wrap
                  ((mg_connection *)0x0,phys_ctx,"check_acl",0x3f7b,
                   "%s: subnet must be [+|-]IP-addr[/x]");
        return -1;
      }
      if (vec.len._4_4_ != 0) {
        matched = iVar1;
      }
    }
    phys_ctx_local._4_4_ = (uint)(matched == 0x2b);
  }
  return phys_ctx_local._4_4_;
}

Assistant:

static int
check_acl(struct mg_context *phys_ctx, const union usa *sa)
{
	int allowed, flag, matched;
	struct vec vec;

	if (phys_ctx) {
		const char *list = phys_ctx->dd.config[ACCESS_CONTROL_LIST];

		/* If any ACL is set, deny by default */
		allowed = (list == NULL) ? '+' : '-';

		while ((list = next_option(list, &vec, NULL)) != NULL) {
			flag = vec.ptr[0];
			matched = -1;
			if ((vec.len > 0) && ((flag == '+') || (flag == '-'))) {
				vec.ptr++;
				vec.len--;
				matched = parse_match_net(&vec, sa, 1);
			}
			if (matched < 0) {
				mg_cry_ctx_internal(phys_ctx,
				                    "%s: subnet must be [+|-]IP-addr[/x]",
				                    __func__);
				return -1;
			}
			if (matched) {
				allowed = flag;
			}
		}

		return allowed == '+';
	}
	return -1;
}